

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_bddInterval(DdManager *dd,int N,DdNode **x,uint lowerB,uint upperB)

{
  DdNode *pDVar1;
  DdNode *n;
  DdNode *pDVar2;
  DdNode *local_c0;
  DdNode *local_b0;
  DdNode *local_98;
  DdNode *local_88;
  DdNode *vu;
  DdNode *vl;
  DdNode *pDStack_58;
  int i;
  DdNode *ru;
  DdNode *rl;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  uint upperB_local;
  uint lowerB_local;
  DdNode **x_local;
  int N_local;
  DdManager *dd_local;
  
  pDVar1 = dd->one;
  *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
  *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
  vl._4_4_ = N + -1;
  pDStack_58 = pDVar1;
  ru = pDVar1;
  one._0_4_ = upperB;
  one._4_4_ = lowerB;
  while( true ) {
    if (vl._4_4_ < 0) {
      dd_local = (DdManager *)Cudd_bddAnd(dd,ru,pDStack_58);
      if (dd_local == (DdManager *)0x0) {
        Cudd_IterDerefBdd(dd,ru);
        Cudd_IterDerefBdd(dd,pDStack_58);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
        Cudd_IterDerefBdd(dd,ru);
        Cudd_IterDerefBdd(dd,pDStack_58);
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
      return &dd_local->sentinel;
    }
    local_88 = pDVar1;
    if ((one._4_4_ & 1) != 0) {
      local_88 = ru;
    }
    local_98 = (DdNode *)((ulong)pDVar1 ^ 1);
    if ((one._4_4_ & 1) == 0) {
      local_98 = ru;
    }
    n = Cudd_bddIte(dd,x[vl._4_4_],local_88,local_98);
    if (n == (DdNode *)0x0) break;
    *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
    Cudd_IterDerefBdd(dd,ru);
    one._4_4_ = one._4_4_ >> 1;
    local_b0 = (DdNode *)((ulong)pDVar1 ^ 1);
    if (((uint)one & 1) != 0) {
      local_b0 = pDStack_58;
    }
    local_c0 = pDVar1;
    if (((uint)one & 1) == 0) {
      local_c0 = pDStack_58;
    }
    pDVar2 = Cudd_bddIte(dd,x[vl._4_4_],local_b0,local_c0);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_IterDerefBdd(dd,n);
      Cudd_IterDerefBdd(dd,pDStack_58);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_IterDerefBdd(dd,pDStack_58);
    one._0_4_ = (uint)one >> 1;
    vl._4_4_ = vl._4_4_ + -1;
    pDStack_58 = pDVar2;
    ru = n;
  }
  Cudd_IterDerefBdd(dd,ru);
  Cudd_IterDerefBdd(dd,pDStack_58);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddInterval(
  DdManager * dd /* DD manager */,
  int  N /* number of x variables */,
  DdNode ** x /* array of x variables */,
  unsigned int lowerB /* lower bound */,
  unsigned int upperB /* upper bound */)
{
    DdNode *one, *zero;
    DdNode *r, *rl, *ru;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    rl = one;
    cuddRef(rl);
    ru = one;
    cuddRef(ru);

    /* Loop to build the rest of the BDDs. */
    for (i = N-1; i >= 0; i--) {
        DdNode *vl, *vu;
        vl = Cudd_bddIte(dd, x[i],
                         lowerB&1 ? rl : one,
                         lowerB&1 ? zero : rl);
        if (vl == NULL) {
            Cudd_IterDerefBdd(dd, rl);
            Cudd_IterDerefBdd(dd, ru);
            return(NULL);
        }
        cuddRef(vl);
        Cudd_IterDerefBdd(dd, rl);
        rl = vl;
        lowerB >>= 1;
        vu = Cudd_bddIte(dd, x[i],
                         upperB&1 ? ru : zero,
                         upperB&1 ? one : ru);
        if (vu == NULL) {
            Cudd_IterDerefBdd(dd, rl);
            Cudd_IterDerefBdd(dd, ru);
            return(NULL);
        }
        cuddRef(vu);
        Cudd_IterDerefBdd(dd, ru);
        ru = vu;
        upperB >>= 1;
    }

    /* Conjoin the two bounds. */
    r = Cudd_bddAnd(dd, rl, ru);
    if (r == NULL) {
        Cudd_IterDerefBdd(dd, rl);
        Cudd_IterDerefBdd(dd, ru);
        return(NULL);
    }
    cuddRef(r);
    Cudd_IterDerefBdd(dd, rl);
    Cudd_IterDerefBdd(dd, ru);
    cuddDeref(r);
    return(r);

}